

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O2

void __thiscall
QArrayDataPointer<_drmModeModeInfo>::relocate
          (QArrayDataPointer<_drmModeModeInfo> *this,qsizetype offset,_drmModeModeInfo **data)

{
  _drmModeModeInfo *d_first;
  _drmModeModeInfo *p_Var1;
  
  d_first = this->ptr + offset;
  QtPrivate::q_relocate_overlap_n<_drmModeModeInfo,long_long>(this->ptr,this->size,d_first);
  if (data != (_drmModeModeInfo **)0x0) {
    p_Var1 = *data;
    if ((this->ptr <= p_Var1) && (p_Var1 < this->ptr + this->size)) {
      *data = p_Var1 + offset;
    }
  }
  this->ptr = d_first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }